

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

void __thiscall
TPathFragmentTable::CopyPathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  TStruct40 *pTVar1;
  bool bVar2;
  char *pcVar3;
  TStruct40 *pStruct40;
  size_t nFragmentOffset_local;
  TMndxSearch *pSearch_local;
  TPathFragmentTable *this_local;
  
  pTVar1 = pSearch->pStruct40;
  bVar2 = TSparseArray::IsEmpty(&this->PathMarks);
  pStruct40 = (TStruct40 *)nFragmentOffset;
  if (bVar2) {
    while (pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40),
          *pcVar3 != '\0') {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      TGenericArray<char>::Insert(&pTVar1->PathBuffer,*pcVar3);
      pStruct40 = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
    }
  }
  else {
    while (bVar2 = TSparseArray::IsItemPresent(&this->PathMarks,(size_t)pStruct40),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      TGenericArray<char>::Insert(&pTVar1->PathBuffer,*pcVar3);
      pStruct40 = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
    }
  }
  return;
}

Assistant:

void CopyPathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if (PathMarks.IsEmpty())
        {
            // HOTS: 195A40C
            while (PathFragments[nFragmentOffset] != 0)
            {
                // Insert the character to the path being built
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }
        else
        {
            // HOTS: 195A4B3
            while(!PathMarks.IsItemPresent(nFragmentOffset))
            {
                // Insert the character to the path being built
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }
    }